

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

void __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,std::complex<double>>,Eigen::Block<Eigen::Matrix<std::complex<double>,2,2,0,2,2>,2,1,true>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>
::
copyCoeff<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,std::complex<double>>,Eigen::Block<Eigen::Matrix<std::complex<double>,2,2,0,2,2>,2,1,true>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,2,1,0,2,1>>>
           *this,Index index,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>_>
          *other)

{
  long lVar1;
  long lVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  complex<double> local_28;
  
  lVar1 = **(long **)this;
  lVar2 = index * 0x10;
  local_28._M_value._0_8_ = *(undefined8 *)(other + 8);
  local_28._M_value._8_8_ = *(undefined8 *)(other + 0x10);
  std::operator/((complex<double> *)(lVar1 + lVar2),&local_28);
  *(ulong *)(lVar1 + lVar2) = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  *(undefined8 *)(lVar1 + 8 + lVar2) = in_XMM1_Qa;
  return;
}

Assistant:

void copyCoeff(Index index, const DenseBase<OtherDerived>& other)
    {
      OtherDerived& _other = other.const_cast_derived();
      eigen_internal_assert(index >= 0 && index < m_matrix.size());
      Scalar& tmp = m_matrix.coeffRef(index);
      tmp = m_functor(tmp, _other.coeff(index));
    }